

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O2

bool __thiscall acto::core::worker_t::process(worker_t *this)

{
  mutex *__mutex;
  byte bVar1;
  object_t *this_00;
  bool bVar2;
  int iVar3;
  long lVar4;
  runtime_t *prVar5;
  undefined4 extraout_var;
  rep rVar6;
  object_t *local_40;
  node<acto::core::object_t> local_38;
  
  do {
    this_00 = this->object_;
    if (this_00 == (object_t *)0x0) {
      return true;
    }
    __mutex = &this_00->cs;
LAB_00108270:
    do {
      object_t::select_message((object_t *)&stack0xffffffffffffffc8);
      if (local_38.next == (object_t *)0x0) {
LAB_001082cd:
        bVar2 = true;
      }
      else {
        local_40 = local_38.next;
        local_38.next = (object_t *)0x0;
        (*this->slots_->_vptr_callbacks[2])(this->slots_,this_00,&local_40);
        if (local_40 != (object_t *)0x0) {
          (*(code *)(((local_40->super_node<acto::core::object_t>).next)->cs).super___mutex_base.
                    _M_mutex.__align)();
        }
        local_40 = (object_t *)0x0;
        if (((this_00->field_0x60 & 2) == 0) &&
           (lVar4 = std::chrono::_V2::steady_clock::now(),
           (this->time_slice_).__r < lVar4 - (this->start_).__d.__r)) goto LAB_001082cd;
        bVar2 = false;
      }
      if (local_38.next != (object_t *)0x0) {
        (*(code *)((((local_38.next)->super_node<acto::core::object_t>).next)->cs).
                  super___mutex_base._M_mutex.__align)();
      }
    } while (!bVar2);
    std::mutex::lock(__mutex);
    bVar1 = this_00->field_0x60;
    if ((bVar1 & 4) != 0) {
      bVar2 = object_t::has_messages(this_00);
      if (!bVar2) goto LAB_00108344;
      (this->time_slice_).__r = 0x7fffffffffffffff;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      goto LAB_00108270;
    }
    if ((bVar1 & 2) != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return true;
    }
    bVar2 = object_t::has_messages(this_00);
    if (bVar2) {
      (*this->slots_->_vptr_callbacks[5])(this->slots_,this_00);
      goto LAB_0010834a;
    }
LAB_00108344:
    this_00->field_0x60 = this_00->field_0x60 & 0xf7;
LAB_0010834a:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((bVar1 & 4) != 0) {
      (*this->slots_->_vptr_callbacks[3])(this->slots_,this_00);
    }
    prVar5 = runtime_t::instance();
    runtime_t::release(prVar5,this_00);
    iVar3 = (*this->slots_->_vptr_callbacks[6])();
    this->object_ = (object_t *)CONCAT44(extraout_var,iVar3);
    if ((object_t *)CONCAT44(extraout_var,iVar3) == (object_t *)0x0) {
      return this_00 == (object_t *)0x0;
    }
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->start_).__d.__r = rVar6;
    prVar5 = runtime_t::instance();
    runtime_t::acquire(prVar5,this->object_);
  } while( true );
}

Assistant:

bool worker_t::process() {
  while (object_t* const obj = object_) {
    bool need_delete = false;

    while (true) {
      // Handle a message.
      if (auto msg = obj->select_message()) {
        slots_->handle_message(obj, std::move(msg));
        // Continue processing messages if the object is bound to the thread or
        // the time slice has not been elapsed yet.
        if (obj->exclusive ||
            time_slice_ >= (std::chrono::steady_clock::now() - start_))
        {
          continue;
        }
      }

      // There are no messages in the object's mailbox or
      // the time slice was elapsed.
      std::lock_guard<std::mutex> g(obj->cs);

      if (obj->deleting) {
        // Drain the object's mailbox if it in the deleting state.
        if (obj->has_messages()) {
          time_slice_ = std::chrono::steady_clock::duration::max();
          continue;
        }

        need_delete = true;
        obj->scheduled = false;
      } else if (obj->exclusive) {
        // Just wait for new messages if the object
        // exclusively bound to the thread.
        return true;
      } else if (obj->has_messages()) {
        // Return object to the shared queue.
        slots_->push_object(obj);
      } else {
        obj->scheduled = false;
      }

      break;
    }

    if (need_delete) {
      slots_->push_delete(obj);
    }
    // Release current object.
    runtime_t::instance()->release(obj);

    // Retrieve next object from the shared queue.
    if ((object_ = slots_->pop_object())) {
      start_ = std::chrono::steady_clock::now();
      runtime_t::instance()->acquire(object_);
    } else {
      // Nothing to do.
      // Put itself to the idle list.
      return false;
    }
  }

  return true;
}